

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

ssize_t google::ReadFromOffset(int fd,void *buf,size_t count,size_t offset)

{
  char cVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  if ((-1 < fd) && (-1 < (long)count)) {
    uVar4 = 0;
    do {
      if (count < uVar4 || count - uVar4 == 0) goto LAB_00120631;
      while (lVar2 = pread(fd,(void *)((long)buf + uVar4),count - uVar4,uVar4 + offset), lVar2 == -1
            ) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) goto LAB_0012063b;
      }
      bVar6 = lVar2 < 0;
      bVar5 = lVar2 == 0;
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      cVar1 = bVar5 * '\x03';
      if (bVar6) {
        cVar1 = '\x01';
      }
      uVar4 = uVar4 + lVar2;
    } while (cVar1 == '\0');
    if (cVar1 == '\x03') {
LAB_00120631:
      if (count < uVar4) goto LAB_00120636;
    }
    else {
LAB_0012063b:
      uVar4 = 0xffffffffffffffff;
    }
    return uVar4;
  }
LAB_00120636:
  abort();
}

Assistant:

static ssize_t ReadFromOffset(const int fd, void* buf, const size_t count,
                              const size_t offset) {
  GLOG_SAFE_ASSERT(fd >= 0);
  GLOG_SAFE_ASSERT(count <=
                   static_cast<size_t>(std::numeric_limits<ssize_t>::max()));
  char* buf0 = reinterpret_cast<char*>(buf);
  size_t num_bytes = 0;
  while (num_bytes < count) {
    ssize_t len = FailureRetry([fd, p = buf0 + num_bytes, n = count - num_bytes,
                                m = static_cast<off_t>(offset + num_bytes)] {
      return pread(fd, p, n, m);
    });
    if (len < 0) {  // There was an error other than EINTR.
      return -1;
    }
    if (len == 0) {  // Reached EOF.
      break;
    }
    num_bytes += static_cast<size_t>(len);
  }
  GLOG_SAFE_ASSERT(num_bytes <= count);
  return static_cast<ssize_t>(num_bytes);
}